

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall
notch::io::PlainTextNetworkReader::read_layer
          (PlainTextNetworkReader *this,istream *in,MakeNet *mknet)

{
  bool bVar1;
  Activation *pAVar2;
  runtime_error *prVar3;
  allocator local_b1;
  string local_b0;
  Array b;
  Array w;
  string tag;
  string activationTag;
  size_t outputDim;
  size_t inputDim;
  
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  tag._M_string_length = 0;
  inputDim = 0;
  tag.field_2._M_local_buf[0] = '\0';
  outputDim = 0;
  std::__cxx11::string::string((string *)&activationTag,"",(allocator *)&local_b0);
  w._M_size = 0;
  w._M_data = (float *)operator_new(0);
  b._M_size = 0;
  b._M_data = (float *)operator_new(0);
  std::__cxx11::string::string((string *)&local_b0,"layer:",&local_b1);
  read_tag_value<std::__cxx11::string>(this,in,&local_b0,&tag);
  std::__cxx11::string::~string((string *)&local_b0);
  read_layer_config(this,in,&inputDim,&outputDim,&activationTag,&w,&b);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tag,
                          "FullyConnectedLayer");
  if (bVar1) {
    pAVar2 = getActivation(this,&activationTag);
    if (pAVar2 == (Activation *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                     "unsupported activation: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &activationTag);
      std::runtime_error::runtime_error(prVar3,(string *)&local_b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    core::MakeNet::addFC(mknet,&w,&b,pAVar2);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tag,"ActivationLayer");
    if (bVar1) {
      pAVar2 = getActivation(this,&activationTag);
      if (pAVar2 == (Activation *)0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0,"unsupported activation: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &activationTag);
        std::runtime_error::runtime_error(prVar3,(string *)&local_b0);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      core::MakeNet::addActivation(mknet,pAVar2);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tag,"EuclideanLoss");
      if (bVar1) {
        core::MakeNet::addL2Loss(mknet);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&tag,"HingeLoss");
        if (bVar1) {
          core::MakeNet::addHingeLoss(mknet);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&tag,"SoftmaxWithLoss");
          if (!bVar1) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0,"unsupported layer type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tag
                          );
            std::runtime_error::runtime_error(prVar3,(string *)&local_b0);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          core::MakeNet::addSoftmax(mknet);
        }
      }
    }
  }
  operator_delete(b._M_data);
  operator_delete(w._M_data);
  std::__cxx11::string::~string((string *)&activationTag);
  std::__cxx11::string::~string((string *)&tag);
  return;
}

Assistant:

void read_layer(std::istream &in, MakeNet &mknet) {
        std::string tag;
        size_t inputDim = 0;
        size_t outputDim = 0;
        std::string activationTag = "";
        Array w(0);
        Array b(0);
        read_tag_value<std::string>(in, "layer:", tag);
        read_layer_config(in, inputDim, outputDim, activationTag, w, b);
        if (tag == "FullyConnectedLayer") {
            auto afptr = getActivation(activationTag);
            if (afptr) {
                mknet.addFC(w, b, *afptr);
            } else {
                throw std::runtime_error("unsupported activation: " +activationTag);
            }
        } else if (tag == "ActivationLayer") {
            auto afptr = getActivation(activationTag);
            if (afptr) {
                mknet.addActivation(*afptr);
            } else {
                throw std::runtime_error("unsupported activation: " +activationTag);
            }
        } else if (tag == "EuclideanLoss") {
            mknet.addL2Loss();
        } else if (tag == "HingeLoss") {
            mknet.addHingeLoss();
        } else if (tag == "SoftmaxWithLoss") {
            mknet.addSoftmax();
        } else {
            throw std::runtime_error("unsupported layer type: " + tag);
        }
    }